

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txin_txinreference.cpp
# Opt level: O3

void __thiscall TxIn_Constractor_Test::TestBody(TxIn_Constractor_Test *this)

{
  AssertHelperData *pAVar1;
  pointer *ppuVar2;
  undefined8 lhs;
  bool bVar3;
  uint32_t uVar4;
  char *pcVar5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  TxIn txin;
  undefined1 local_138 [32];
  internal local_118 [8];
  _Alloc_hider local_110;
  undefined1 local_108 [32];
  Script local_e8;
  AbstractTxIn local_b0;
  
  cfd::core::TxIn::TxIn((TxIn *)&local_b0,&exp_txid,0,0xffffffff);
  local_138._0_4_ = cfd::core::AbstractTxIn::GetVout(&local_b0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_e8,"txin.GetVout()","exp_index",(uint *)local_138,&exp_index);
  if ((char)local_e8._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_138);
    if (local_e8.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e8.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x22,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    if ((AssertHelperData *)local_138._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::core::AbstractTxIn::GetSequence(&local_b0);
  local_138._0_4_ = uVar4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_e8,"txin.GetSequence()","exp_sequence",(uint *)local_138,
             &exp_sequence);
  if ((char)local_e8._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_138);
    if (local_e8.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e8.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x23,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    if ((AssertHelperData *)local_138._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetTxid((Txid *)local_138,&local_b0);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_e8,(Txid *)local_138);
  pcVar5 = (char *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_108,&exp_txid);
  testing::internal::CmpHelperSTREQ
            (local_118,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",pcVar5,
             (char *)local_108._0_8_);
  pAVar1 = (AssertHelperData *)(local_108 + 0x10);
  if ((AssertHelperData *)local_108._0_8_ != pAVar1) {
    operator_delete((void *)local_108._0_8_);
  }
  ppuVar2 = (pointer *)
            ((long)&local_e8.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  if ((pointer *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != ppuVar2) {
    operator_delete((undefined1 *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script))
    ;
  }
  local_138._0_8_ = &PTR__Txid_00678d28;
  if ((pointer)local_138._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_138._8_8_);
  }
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_110._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_110._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x24,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if (CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) + 8)
        )();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_b0);
  cfd::core::TxIn::TxIn((TxIn *)&local_b0,&exp_txid,0,0xffffffff,&exp_script);
  uVar4 = cfd::core::AbstractTxIn::GetVout(&local_b0);
  local_138._0_4_ = uVar4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_e8,"txin.GetVout()","exp_index",(uint *)local_138,&exp_index);
  if ((char)local_e8._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_138);
    if (local_e8.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e8.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x29,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    if ((AssertHelperData *)local_138._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::core::AbstractTxIn::GetSequence(&local_b0);
  local_138._0_4_ = uVar4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_e8,"txin.GetSequence()","exp_sequence",(uint *)local_138,
             &exp_sequence);
  if ((char)local_e8._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_138);
    if (local_e8.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e8.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x2a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    if ((AssertHelperData *)local_138._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetTxid((Txid *)local_138,&local_b0);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_e8,(Txid *)local_138);
  pcVar5 = (char *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_108,&exp_txid);
  testing::internal::CmpHelperSTREQ
            (local_118,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",pcVar5,
             (char *)local_108._0_8_);
  if ((AssertHelperData *)local_108._0_8_ != pAVar1) {
    operator_delete((void *)local_108._0_8_);
  }
  if ((pointer *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != ppuVar2) {
    operator_delete((undefined1 *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script))
    ;
  }
  local_138._0_8_ = &PTR__Txid_00678d28;
  if ((pointer)local_138._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_138._8_8_);
  }
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_110._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_110._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x2b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if (CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) + 8)
        )();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetUnlockingScript(&local_e8,&local_b0);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_138,&local_e8);
  lhs = local_138._0_8_;
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_108,&exp_script);
  testing::internal::CmpHelperSTREQ
            (local_118,"txin.GetUnlockingScript().GetHex().c_str()","exp_script.GetHex().c_str()",
             (char *)lhs,(char *)local_108._0_8_);
  if ((AssertHelperData *)local_108._0_8_ != pAVar1) {
    operator_delete((void *)local_108._0_8_);
  }
  if ((AssertHelperData *)local_138._0_8_ != (AssertHelperData *)(local_138 + 0x10)) {
    operator_delete((void *)local_138._0_8_);
  }
  cfd::core::Script::~Script(&local_e8);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_110._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_110._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x2d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if (CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT71(local_e8._vptr_Script._1_7_,(char)local_e8._vptr_Script) + 8)
        )();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_b0);
  return;
}

Assistant:

TEST(TxIn, Constractor) {
  {
    TxIn txin(exp_txid, exp_index, exp_sequence);
    EXPECT_EQ(txin.GetVout(), exp_index);
    EXPECT_EQ(txin.GetSequence(), exp_sequence);
    EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  }

  {
    TxIn txin(exp_txid, exp_index, exp_sequence, exp_script);
    EXPECT_EQ(txin.GetVout(), exp_index);
    EXPECT_EQ(txin.GetSequence(), exp_sequence);
    EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
    EXPECT_STREQ(txin.GetUnlockingScript().GetHex().c_str(),
                 exp_script.GetHex().c_str());
  }
}